

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uri.hpp
# Opt level: O2

void __thiscall cinatra::context::context(context *this,uri_t *u,http_method mthd)

{
  uri_t::get_host_abi_cxx11_(&this->host,u);
  uri_t::get_port_abi_cxx11_(&this->port,u);
  uri_t::get_path_abi_cxx11_(&this->path,u);
  uri_t::get_query_abi_cxx11_(&this->query,u);
  (this->body)._M_dataplus._M_p = (pointer)&(this->body).field_2;
  (this->body)._M_string_length = 0;
  (this->body).field_2._M_local_buf[0] = '\0';
  this->method = mthd;
  return;
}

Assistant:

context(const uri_t &u, http_method mthd)
      : host(u.get_host()),
        port(u.get_port()),
        path(u.get_path()),
        query(u.get_query()),
        method(mthd) {}